

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O0

void __thiscall Js::ParseableFunctionInfo::SetIsNonUserCode(ParseableFunctionInfo *this,bool set)

{
  undefined1 local_11;
  ParseableFunctionInfo *pPStack_10;
  bool set_local;
  ParseableFunctionInfo *this_local;
  
  local_11 = set;
  pPStack_10 = this;
  SetFlags(this,set,Flags_NonUserCode);
  ForEachNestedFunc<Js::ParseableFunctionInfo::SetIsNonUserCode(bool)::__0>
            (this,(anon_class_8_1_ba1d77c2)&local_11);
  return;
}

Assistant:

void ParseableFunctionInfo::SetIsNonUserCode(bool set)
    {
        // Mark current function as a non-user code, so that we can distinguish cases where exceptions are
        // caught in non-user code (see ProbeContainer::HasAllowedForException).
        SetFlags(set, Flags_NonUserCode);

        // Propagate setting for all functions in this scope (nested).
        this->ForEachNestedFunc([&](FunctionProxy* proxy, uint32 index)
        {
            ParseableFunctionInfo * pBody = proxy->GetParseableFunctionInfo();
            if (pBody != nullptr)
            {
                pBody->SetIsNonUserCode(set);
            }
            return true;
        });
    }